

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

int Aig_ObjIsMuxType(Aig_Obj_t *pNode)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  if (((ulong)pNode & 1) == 0) {
    uVar1 = 0;
    if (((((*(uint *)&pNode->field_0x18 & 7) == 5) && (((ulong)pNode->pFanin0 & 1) != 0)) &&
        (((ulong)pNode->pFanin1 & 1) != 0)) &&
       ((uVar2 = (ulong)pNode->pFanin0 & 0xfffffffffffffffe, (*(uint *)(uVar2 + 0x18) & 7) == 5 &&
        (uVar5 = (ulong)pNode->pFanin1 & 0xfffffffffffffffe, (*(uint *)(uVar5 + 0x18) & 7) == 5))))
    {
      uVar9 = *(ulong *)(uVar2 + 8) & 0xfffffffffffffffe;
      uVar6 = *(ulong *)(uVar5 + 8) & 0xfffffffffffffffe;
      uVar1 = 1;
      uVar3 = (uint)*(ulong *)(uVar5 + 8);
      uVar8 = (uint)*(ulong *)(uVar2 + 8);
      if ((uVar9 != uVar6) || (((uVar3 ^ uVar8) & 1) == 0)) {
        uVar7 = *(ulong *)(uVar5 + 0x10) & 0xfffffffffffffffe;
        uVar4 = (uint)*(ulong *)(uVar5 + 0x10);
        if ((uVar9 != uVar7) || (((uVar8 ^ uVar4) & 1) == 0)) {
          uVar5 = *(ulong *)(uVar2 + 0x10) & 0xfffffffffffffffe;
          uVar8 = (uint)*(ulong *)(uVar2 + 0x10);
          if (((uVar5 != uVar6) || (((uVar3 ^ uVar8) & 1) == 0)) && (uVar1 = 0, uVar5 == uVar7)) {
            uVar1 = (uVar8 ^ uVar4) & 1;
          }
        }
      }
    }
    return uVar1;
  }
  __assert_fail("!Aig_IsComplement(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigUtil.c"
                ,0x137,"int Aig_ObjIsMuxType(Aig_Obj_t *)");
}

Assistant:

int Aig_ObjIsMuxType( Aig_Obj_t * pNode )
{
    Aig_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Aig_IsComplement(pNode) );
    // if the node is not AND, this is not MUX
    if ( !Aig_ObjIsAnd(pNode) )
        return 0;
    // if the children are not complemented, this is not MUX
    if ( !Aig_ObjFaninC0(pNode) || !Aig_ObjFaninC1(pNode) )
        return 0;
    // get children
    pNode0 = Aig_ObjFanin0(pNode);
    pNode1 = Aig_ObjFanin1(pNode);
    // if the children are not ANDs, this is not MUX
    if ( !Aig_ObjIsAnd(pNode0) || !Aig_ObjIsAnd(pNode1) )
        return 0;
    // otherwise the node is MUX iff it has a pair of equal grandchildren
    return (Aig_ObjFanin0(pNode0) == Aig_ObjFanin0(pNode1) && (Aig_ObjFaninC0(pNode0) ^ Aig_ObjFaninC0(pNode1))) || 
           (Aig_ObjFanin0(pNode0) == Aig_ObjFanin1(pNode1) && (Aig_ObjFaninC0(pNode0) ^ Aig_ObjFaninC1(pNode1))) ||
           (Aig_ObjFanin1(pNode0) == Aig_ObjFanin0(pNode1) && (Aig_ObjFaninC1(pNode0) ^ Aig_ObjFaninC0(pNode1))) ||
           (Aig_ObjFanin1(pNode0) == Aig_ObjFanin1(pNode1) && (Aig_ObjFaninC1(pNode0) ^ Aig_ObjFaninC1(pNode1)));
}